

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O3

void __thiscall wasm::GenerateDynCalls::~GenerateDynCalls(GenerateDynCalls *this)

{
  _List_node_base *p_Var1;
  pointer pTVar2;
  _List_node_base *p_Var3;
  
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__GenerateDynCalls_010725f0;
  p_Var3 = (this->invokeTypes).List.
           super__List_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&(this->invokeTypes).List) {
    p_Var1 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var1;
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&this->invokeTypes);
  pTVar2 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>_>
           ).super_PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>.
           super_Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>::Task,_std::allocator<wasm::Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>
                                          .
                                          super_Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>::Task,_std::allocator<wasm::Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar2);
  }
  Pass::~Pass((Pass *)this);
  operator_delete(this,0x188);
  return;
}

Assistant:

GenerateDynCalls(bool onlyI64) : onlyI64(onlyI64) {}